

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

int __thiscall
CVmObject::getp_propinh
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc,vm_prop_id_t param_4,
          vm_obj_id_t *param_5)

{
  undefined2 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  bool bVar5;
  vm_obj_id_t source_obj;
  vm_val_t val;
  
  if (in_argc == (uint *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = 3 < *in_argc;
  }
  if ((getp_propinh(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc == '\0'
      ) && (iVar4 = __cxa_guard_acquire(&getp_propinh(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                         ::desc), iVar4 != 0)) {
    getp_propinh::desc.min_argc_ = 3;
    getp_propinh::desc.opt_argc_ = 1;
    getp_propinh::desc.varargs_ = 0;
    __cxa_guard_release(&getp_propinh(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                         ::desc);
  }
  iVar4 = get_prop_check_argc(retval,in_argc,&getp_propinh::desc);
  if (iVar4 == 0) {
    CVmRun::pop_prop(&G_interpreter_X,&val);
    uVar1 = val.val.prop;
    CVmRun::pop_obj(&G_interpreter_X,&val);
    uVar2 = val.val.obj;
    CVmRun::pop_obj(&G_interpreter_X,&val);
    uVar3 = val.val.obj;
    if (bVar5) {
      CVmRun::pop_int(&G_interpreter_X,&val);
      source_obj = 0;
      iVar4 = (*this->_vptr_CVmObject[0xf])
                        (this,(ulong)(ushort)uVar1,&val,(ulong)self,(ulong)(uint)uVar2,
                         (ulong)(uint)uVar3,&source_obj,0);
      if (val.val.obj == 4) {
        if (iVar4 != 0) {
          if (source_obj != 0) {
            self = source_obj;
          }
          retval->typ = VM_OBJ;
          (retval->val).obj = self;
          return 1;
        }
        retval->typ = VM_NIL;
        return 1;
      }
      if (val.val.obj != 1) {
        err_throw(0x902);
      }
    }
    else {
      source_obj = 0;
      iVar4 = (*this->_vptr_CVmObject[0xf])
                        (this,(ulong)(ushort)uVar1,&val,(ulong)self,(ulong)(uint)uVar2,
                         (ulong)val.val.obj,&source_obj,0);
    }
    retval->typ = VM_TRUE - (iVar4 == 0);
  }
  return 1;
}

Assistant:

int CVmObject::getp_propinh(VMG_ vm_obj_id_t self,
                            vm_val_t *retval, uint *in_argc,
                            vm_prop_id_t, vm_obj_id_t *)
{
    uint argc = (in_argc != 0 ? *in_argc : 0);
    vm_val_t val;
    int flags;
    int found;
    vm_prop_id_t prop;
    vm_obj_id_t source_obj;
    vm_obj_id_t orig_target_obj;
    vm_obj_id_t defining_obj;
    static CVmNativeCodeDesc desc(3, 1);

    /* check arguments */
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* pop the property address to test */
    G_interpreter->pop_prop(vmg_ &val);
    prop = val.val.prop;

    /* get the original target object */
    G_interpreter->pop_obj(vmg_ &val);
    orig_target_obj = val.val.obj;

    /* get the defining object */
    G_interpreter->pop_obj(vmg_ &val);
    defining_obj = val.val.obj;

    /* if we have the flag argument, get it; otherwise, use the default */
    if (argc >= 4)
    {
        /* get the flag value */
        G_interpreter->pop_int(vmg_ &val);
        flags = (int)val.val.intval;
    }
    else
    {
        /* use the default flags */
        flags = VMOBJ_PROPDEF_ANY;
    }

    /* presume we won't find a valid source object */
    source_obj = VM_INVALID_OBJ;

    /* look up the property */
    found = inh_prop(vmg_ prop, &val, self, orig_target_obj, defining_obj,
                     &source_obj, 0);

    /* check the flags */
    switch(flags)
    {
    case VMOBJ_PROPDEF_ANY:
        /* return true if the property is defined */
        retval->set_logical(found);
        break;

    case VMOBJ_PROPDEF_GET_CLASS:
        /* return the defining class, or nil if it's not defined */
        if (found)
        {
            /* return the source object, or 'self' if we didn't find one */
            retval->set_obj(source_obj != VM_INVALID_OBJ ? source_obj : self);
        }
        else
        {
            /* didn't find it - the return value is nil */
            retval->set_nil();
        }
        break;

    default:
        /* other flags are invalid */
        err_throw(VMERR_BAD_VAL_BIF);
        break;
    }

    /* handled */
    return TRUE;
}